

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O3

GLFWglproc getProcAddressEGL(char *procname)

{
  void *pvVar1;
  GLFWproc p_Var2;
  GLFWglproc p_Var3;
  
  pvVar1 = _glfwPlatformGetTls(&_glfw.contextSlot);
  if (pvVar1 == (void *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sonoro1234[P]LuaJIT-GLFW/GLFW/src/egl_context.c"
                  ,0x138,"GLFWglproc getProcAddressEGL(const char *)");
  }
  if (*(void **)((long)pvVar1 + 0x2a0) != (void *)0x0) {
    p_Var2 = _glfwPlatformGetModuleSymbol(*(void **)((long)pvVar1 + 0x2a0),procname);
    if (p_Var2 != (GLFWproc)0x0) {
      return p_Var2;
    }
  }
  p_Var3 = (*_glfw.egl.GetProcAddress)(procname);
  return p_Var3;
}

Assistant:

static GLFWglproc getProcAddressEGL(const char* procname)
{
    _GLFWwindow* window = _glfwPlatformGetTls(&_glfw.contextSlot);
    assert(window != NULL);

    if (window->context.egl.client)
    {
        GLFWglproc proc = (GLFWglproc)
            _glfwPlatformGetModuleSymbol(window->context.egl.client, procname);
        if (proc)
            return proc;
    }

    return eglGetProcAddress(procname);
}